

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceGLImpl::CreateTLAS
          (RenderDeviceGLImpl *this,TopLevelASDesc *Desc,ITopLevelAS **ppTLAS)

{
  string msg;
  string local_30;
  
  FormatString<char[38]>(&local_30,(char (*) [38])"CreateTLAS is not supported in OpenGL");
  DebugAssertionFailed
            (local_30._M_dataplus._M_p,"CreateTLAS",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x275);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  *ppTLAS = (ITopLevelAS *)0x0;
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateTLAS(const TopLevelASDesc& Desc,
                                    ITopLevelAS**         ppTLAS)
{
    UNSUPPORTED("CreateTLAS is not supported in OpenGL");
    *ppTLAS = nullptr;
}